

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXNodeAttribute.cpp
# Opt level: O0

void __thiscall
Assimp::FBX::CameraSwitcher::CameraSwitcher
          (CameraSwitcher *this,uint64_t id,Element *element,Document *doc,string *name)

{
  int iVar1;
  Scope *pSVar2;
  Element *pEVar3;
  Token *pTVar4;
  TokenList *this_00;
  size_type sVar5;
  string local_118;
  string local_f8;
  allocator local_d1;
  string local_d0;
  Element *local_b0;
  Element *CameraIndexName;
  string local_a0;
  Element *local_80;
  Element *CameraName;
  string local_70;
  Element *local_50;
  Element *CameraId;
  Scope *local_38;
  Scope *sc;
  string *name_local;
  Document *doc_local;
  Element *element_local;
  uint64_t id_local;
  CameraSwitcher *this_local;
  
  sc = (Scope *)name;
  name_local = (string *)doc;
  doc_local = (Document *)element;
  element_local = (Element *)id;
  id_local = (uint64_t)this;
  NodeAttribute::NodeAttribute(&this->super_NodeAttribute,id,element,doc,name);
  (this->super_NodeAttribute).super_Object._vptr_Object =
       (_func_int **)&PTR__CameraSwitcher_0037b988;
  std::__cxx11::string::string((string *)&this->cameraName);
  std::__cxx11::string::string((string *)&this->cameraIndexName);
  pSVar2 = GetRequiredScope((Element *)doc_local);
  local_38 = pSVar2;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"CameraId",(allocator *)((long)&CameraName + 7));
  pEVar3 = Scope::operator[](pSVar2,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&CameraName + 7));
  pSVar2 = local_38;
  local_50 = pEVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_a0,"CameraName",(allocator *)((long)&CameraIndexName + 7));
  pEVar3 = Scope::operator[](pSVar2,&local_a0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator((allocator<char> *)((long)&CameraIndexName + 7));
  pSVar2 = local_38;
  local_80 = pEVar3;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_d0,"CameraIndexName",&local_d1);
  pEVar3 = Scope::operator[](pSVar2,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  local_b0 = pEVar3;
  if (local_50 != (Element *)0x0) {
    pTVar4 = GetRequiredToken(local_50,0);
    iVar1 = ParseTokenAsInt(pTVar4);
    this->cameraId = iVar1;
  }
  if (local_80 != (Element *)0x0) {
    pTVar4 = GetRequiredToken(local_80,0);
    Token::StringContents_abi_cxx11_(&local_f8,pTVar4);
    std::__cxx11::string::operator=((string *)&this->cameraName,(string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  if (local_b0 != (Element *)0x0) {
    this_00 = Element::Tokens(local_b0);
    sVar5 = std::vector<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>::
            size(this_00);
    if (sVar5 != 0) {
      pTVar4 = GetRequiredToken(local_b0,0);
      Token::StringContents_abi_cxx11_(&local_118,pTVar4);
      std::__cxx11::string::operator=((string *)&this->cameraIndexName,(string *)&local_118);
      std::__cxx11::string::~string((string *)&local_118);
    }
  }
  return;
}

Assistant:

CameraSwitcher::CameraSwitcher(uint64_t id, const Element& element, const Document& doc, const std::string& name)
    : NodeAttribute(id,element,doc,name)
{
    const Scope& sc = GetRequiredScope(element);
    const Element* const CameraId = sc["CameraId"];
    const Element* const CameraName = sc["CameraName"];
    const Element* const CameraIndexName = sc["CameraIndexName"];

    if(CameraId) {
        cameraId = ParseTokenAsInt(GetRequiredToken(*CameraId,0));
    }

    if(CameraName) {
        cameraName = GetRequiredToken(*CameraName,0).StringContents();
    }

    if(CameraIndexName && CameraIndexName->Tokens().size()) {
        cameraIndexName = GetRequiredToken(*CameraIndexName,0).StringContents();
    }
}